

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall
helics::FederateState::fillEventVectorInclusive(FederateState *this,Time currentTime)

{
  pointer pIVar1;
  pointer puVar2;
  iterator iVar3;
  pointer puVar4;
  bool bVar5;
  InterfaceHandle *pIVar6;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  pointer puVar7;
  pointer puVar8;
  unique_lock<std::shared_mutex> local_40;
  
  pIVar1 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  local_40._M_device = &(this->interfaceInformation).inputs.m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar7 = (this->interfaceInformation).inputs.m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar7 != puVar2) {
    do {
      bVar5 = InputInfo::updateTimeInclusive
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                         .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl,currentTime
                        );
      if (bVar5) {
        pIVar6 = &(((puVar7->_M_t).
                    super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                    .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->id).handle;
        iVar3._M_current =
             (this->events).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->events).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
          _M_realloc_insert<helics::InterfaceHandle_const&>
                    ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                     &this->events,iVar3,pIVar6);
        }
        else {
          (iVar3._M_current)->hid = pIVar6->hid;
          (this->events).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  pIVar1 = (this->eventMessages).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->eventMessages).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  local_40._M_device = &(this->interfaceInformation).endpoints.m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar8 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(pointer *)
            ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar8 != puVar4) {
    do {
      bVar5 = EndpointInfo::updateTimeInclusive
                        ((puVar8->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,
                         currentTime);
      if (bVar5) {
        pIVar6 = &(((puVar8->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle;
        iVar3._M_current =
             (this->eventMessages).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->eventMessages).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
          _M_realloc_insert<helics::InterfaceHandle_const&>
                    ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                     &this->eventMessages,iVar3,pIVar6);
        }
        else {
          (iVar3._M_current)->hid = pIVar6->hid;
          (this->eventMessages).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar4);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void FederateState::fillEventVectorInclusive(Time currentTime)
{
    events.clear();
    for (const auto& ipt : interfaceInformation.getInputs()) {
        if (ipt->updateTimeInclusive(currentTime)) {
            events.push_back(ipt->id.handle);
        }
    }
    eventMessages.clear();
    for (const auto& ept : interfaceInformation.getEndpoints()) {
        if (ept->updateTimeInclusive(currentTime)) {
            eventMessages.push_back(ept->id.handle);
        }
    }
}